

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O3

Aig_Man_t * Saig_ManReadBlif(char *pFileName)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Aig_Man_t *pAVar6;
  Aig_Man_t *p;
  size_t sVar7;
  char *pcVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  long lVar11;
  int *pNum2Id;
  void *pvVar12;
  char *pcVar13;
  Aig_Man_t *p_00;
  Vec_Ptr_t *p_01;
  char *pToken;
  Aig_Obj_t *p0;
  bool bVar14;
  double dVar15;
  undefined1 auVar16 [16];
  int local_54;
  
  pAVar6 = (Aig_Man_t *)fopen(pFileName,"r");
  if (pAVar6 == (Aig_Man_t *)0x0) {
    pcVar8 = "Saig_ManReadBlif(): Cannot open file for reading.";
  }
  else {
    do {
      iVar2 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
      if (iVar2 != 1) {
        pcVar8 = "Saig_ManReadBlif(): Error 1.";
        goto LAB_0062b0ff;
      }
    } while (Saig_ManReadToken::Buffer[0] != '.');
    iVar2 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
    if (iVar2 == 1) {
      p = Aig_ManStart(10000);
      sVar7 = strlen(Saig_ManReadToken::Buffer);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,Saig_ManReadToken::Buffer);
      p->pName = pcVar8;
      if (pFileName == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        sVar7 = strlen(pFileName);
        pcVar8 = (char *)malloc(sVar7 + 1);
        strcpy(pcVar8,pFileName);
      }
      p->pSpec = pcVar8;
      iVar2 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
      if ((iVar2 == 1) &&
         (CONCAT17(Saig_ManReadToken::Buffer[7],
                   CONCAT25(Saig_ManReadToken::Buffer._5_2_,
                            CONCAT14(Saig_ManReadToken::Buffer[4],
                                     CONCAT13(Saig_ManReadToken::Buffer[3],
                                              CONCAT12(Saig_ManReadToken::Buffer[2],
                                                       CONCAT11(Saig_ManReadToken::Buffer[1],
                                                                Saig_ManReadToken::Buffer[0]))))))
          == 0x737475706e692e)) {
        iVar2 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
        if (iVar2 == 1) {
          iVar2 = 0;
          do {
            if (Saig_ManReadToken::Buffer[0] == '.') {
              if (Saig_ManReadToken::Buffer[8] == '\0' &&
                  CONCAT17(Saig_ManReadToken::Buffer[7],
                           CONCAT25(Saig_ManReadToken::Buffer._5_2_,
                                    CONCAT14(Saig_ManReadToken::Buffer[4],
                                             CONCAT13(Saig_ManReadToken::Buffer[3],
                                                      CONCAT12(Saig_ManReadToken::Buffer[2],
                                                               CONCAT11(Saig_ManReadToken::Buffer[1]
                                                                        ,0x2e)))))) ==
                  0x7374757074756f2e) {
                iVar3 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
                if (iVar3 != 1) goto LAB_0062b22c;
                iVar3 = 0;
                goto LAB_0062b20c;
              }
              break;
            }
            iVar3 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
            iVar2 = iVar2 + -1;
          } while (iVar3 == 1);
        }
        pcVar8 = "Saig_ManReadBlif(): Error 4.";
      }
      else {
        pcVar8 = "Saig_ManReadBlif(): Error 3.";
      }
      goto LAB_0062b1cd;
    }
    pcVar8 = "Saig_ManReadBlif(): Error 2.";
  }
LAB_0062b0ff:
  puts(pcVar8);
  return (Aig_Man_t *)0x0;
  while( true ) {
    iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
    iVar3 = iVar3 + -1;
    if (iVar4 != 1) break;
LAB_0062b20c:
    if (Saig_ManReadToken::Buffer[0] == '.') {
      local_54 = 0;
      if (CONCAT22(Saig_ManReadToken::Buffer._5_2_,
                   CONCAT11(Saig_ManReadToken::Buffer[4],Saig_ManReadToken::Buffer[3])) != 0x686374
          || CONCAT13(Saig_ManReadToken::Buffer[3],
                      CONCAT12(Saig_ManReadToken::Buffer[2],
                               CONCAT11(Saig_ManReadToken::Buffer[1],0x2e))) != 0x74616c2e)
      goto LAB_0062b25b;
      local_54 = 0;
      goto LAB_0062b2e6;
    }
  }
LAB_0062b22c:
  pcVar8 = "Saig_ManReadBlif(): Error 5.";
  goto LAB_0062b1cd;
  while( true ) {
    iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
    if (iVar4 != 1) {
      pcVar8 = "Saig_ManReadBlif(): Error 8.";
      goto LAB_0062b1cd;
    }
    iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
    if (iVar4 != 1) {
      pcVar8 = "Saig_ManReadBlif(): Error 9.";
      goto LAB_0062b1cd;
    }
    local_54 = local_54 + 1;
    if (CONCAT22(Saig_ManReadToken::Buffer._5_2_,
                 CONCAT11(Saig_ManReadToken::Buffer[4],Saig_ManReadToken::Buffer[3])) != 0x686374 ||
        CONCAT13(Saig_ManReadToken::Buffer[3],
                 CONCAT12(Saig_ManReadToken::Buffer[2],
                          CONCAT11(Saig_ManReadToken::Buffer[1],Saig_ManReadToken::Buffer[0]))) !=
        0x74616c2e) break;
LAB_0062b2e6:
    iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
    if (iVar4 != 1) {
      pcVar8 = "Saig_ManReadBlif(): Error 6.";
      goto LAB_0062b1cd;
    }
    iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
    if (iVar4 != 1) {
      pcVar8 = "Saig_ManReadBlif(): Error 7.";
      goto LAB_0062b1cd;
    }
  }
LAB_0062b25b:
  for (iVar2 = local_54 - iVar2; iVar2 != 0; iVar2 = iVar2 + -1) {
    Aig_ObjCreateCi(p);
  }
  Aig_ManSetRegNum(p,local_54);
  if (CONCAT22(Saig_ManReadToken::Buffer._5_2_,
               CONCAT11(Saig_ManReadToken::Buffer[4],Saig_ManReadToken::Buffer[3])) == 0x73656d &&
      CONCAT13(Saig_ManReadToken::Buffer[3],
               CONCAT12(Saig_ManReadToken::Buffer[2],
                        CONCAT11(Saig_ManReadToken::Buffer[1],Saig_ManReadToken::Buffer[0]))) ==
      0x6d616e2e) {
    iVar2 = 0;
    pNum2Id = (int *)0x0;
    do {
      pToken = Saig_ManReadToken::Buffer;
      iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
      pcVar8 = Saig_ManReadToken::Buffer;
      if (iVar4 != 1) {
        pcVar8 = (char *)0x0;
      }
      bVar14 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if ((bVar14) && (*pcVar8 == 'n')) {
        iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
        if ((iVar4 != 1) ||
           (CONCAT11(Saig_ManReadToken::Buffer[1],Saig_ManReadToken::Buffer[0]) != 0x31)) {
          pcVar8 = "Saig_ManReadBlif(): Error 10.";
          goto LAB_0062b1cd;
        }
        iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
        if (iVar4 != 1) {
          pcVar8 = "Saig_ManReadBlif(): Error 11.";
          goto LAB_0062b1cd;
        }
      }
      else {
        pAVar9 = Saig_ManReadNode(p,pNum2Id,pcVar8);
        iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
        pcVar8 = Saig_ManReadToken::Buffer;
        if (iVar4 != 1) {
          pcVar8 = (char *)0x0;
        }
        if (*pcVar8 == 'l') {
          pcVar13 = Saig_ManReadToken::Buffer;
          if (iVar4 != 1) {
            pcVar13 = (char *)0x0;
          }
          if (pcVar13[1] == 'i') {
LAB_0062b452:
            iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
            cVar1 = Saig_ManReadToken::Buffer[0];
            if (iVar4 == 1) {
              iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
              if ((iVar4 == 1) &&
                 (CONCAT11(Saig_ManReadToken::Buffer[1],Saig_ManReadToken::Buffer[0]) == 0x31)) {
                pAVar10 = (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
                if (cVar1 != '0') {
                  pAVar10 = pAVar9;
                }
                Aig_ObjCreateCo(p,pAVar10);
                iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
                if (iVar4 == 1) goto LAB_0062b66c;
                pcVar8 = "Saig_ManReadBlif(): Error 14.";
              }
              else {
                pcVar8 = "Saig_ManReadBlif(): Error 13.";
              }
            }
            else {
              pcVar8 = "Saig_ManReadBlif(): Error 12.";
            }
            goto LAB_0062b1cd;
          }
        }
        else if (*pcVar8 == 'p') {
          pcVar13 = Saig_ManReadToken::Buffer;
          if (iVar4 != 1) {
            pcVar13 = (char *)0x0;
          }
          if (pcVar13[1] == 'o') goto LAB_0062b452;
        }
        pAVar10 = Saig_ManReadNode(p,pNum2Id,pcVar8);
        p_00 = pAVar6;
        iVar4 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
        if (iVar4 != 1) {
          pToken = (char *)0x0;
        }
        iVar4 = Saig_ManReadNumber(p_00,pToken);
        if (pNum2Id == (int *)0x0) {
          sVar7 = strlen(pToken);
          lVar11 = sVar7 - 1;
          auVar16._8_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar16._0_8_ = lVar11;
          auVar16._12_4_ = 0x45300000;
          dVar15 = pow(10.0,(auVar16._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0));
          pNum2Id = (int *)calloc((long)(int)dVar15,4);
        }
        iVar5 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
        if (iVar5 != 1) {
          pcVar8 = "Saig_ManReadBlif(): Error 15.";
          goto LAB_0062b1cd;
        }
        p0 = (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
        if (Saig_ManReadToken::Buffer[0] != '0') {
          p0 = pAVar9;
        }
        pAVar9 = (Aig_Obj_t *)((ulong)pAVar10 ^ 1);
        if (Saig_ManReadToken::Buffer[1] != '0') {
          pAVar9 = pAVar10;
        }
        iVar5 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
        if ((iVar5 != 1) ||
           (CONCAT11(Saig_ManReadToken::Buffer[1],Saig_ManReadToken::Buffer[0]) != 0x31)) {
          pcVar8 = "Saig_ManReadBlif(): Error 16.";
          goto LAB_0062b1cd;
        }
        iVar5 = __isoc99_fscanf(pAVar6,"%s",Saig_ManReadToken::Buffer);
        if (iVar5 != 1) {
          pcVar8 = "Saig_ManReadBlif(): Error 17.";
          goto LAB_0062b1cd;
        }
        pAVar9 = Aig_And(p,p0,pAVar9);
        if (((ulong)pAVar9 & 1) != 0) {
          pcVar8 = "Saig_ManReadBlif(): Error 18.";
          goto LAB_0062b1cd;
        }
        pNum2Id[iVar4] = pAVar9->Id;
      }
LAB_0062b66c:
    } while (CONCAT22(Saig_ManReadToken::Buffer._5_2_,
                      CONCAT11(Saig_ManReadToken::Buffer[4],Saig_ManReadToken::Buffer[3])) ==
             0x73656d &&
             CONCAT13(Saig_ManReadToken::Buffer[3],
                      CONCAT12(Saig_ManReadToken::Buffer[2],
                               CONCAT11(Saig_ManReadToken::Buffer[1],Saig_ManReadToken::Buffer[0])))
             == 0x6d616e2e);
  }
  else {
    pNum2Id = (int *)0x0;
  }
  if (Saig_ManReadToken::Buffer[4] == '\0' &&
      CONCAT13(Saig_ManReadToken::Buffer[3],
               CONCAT12(Saig_ManReadToken::Buffer[2],
                        CONCAT11(Saig_ManReadToken::Buffer[1],Saig_ManReadToken::Buffer[0]))) ==
      0x646e652e) {
    if (local_54 - p->nObjs[3] == iVar3) {
      p_01 = p->vCis;
      if (0 < p_01->nSize) {
        iVar2 = 0;
        do {
          pvVar12 = Vec_PtrEntry(p_01,iVar2);
          pNum2Id[*(int *)((long)pvVar12 + 0x24)] = *(int *)((long)pvVar12 + 0x24);
          iVar2 = iVar2 + 1;
          p_01 = p->vCis;
        } while (iVar2 < p_01->nSize);
      }
      p->pData = pNum2Id;
      Aig_ManSetRegNum(p,local_54);
      iVar2 = Aig_ManCheck(p);
      if (iVar2 == 0) {
        puts("Saig_ManReadBlif(): Check has failed.");
        return p;
      }
      return p;
    }
    pcVar8 = "Saig_ManReadBlif(): Error 20.";
  }
  else {
    pcVar8 = "Saig_ManReadBlif(): Error 19.";
  }
LAB_0062b1cd:
  puts(pcVar8);
  Aig_ManStop(p);
  return (Aig_Man_t *)0x0;
}

Assistant:

Aig_Man_t * Saig_ManReadBlif( char * pFileName )
{
    FILE * pFile;
    Aig_Man_t * p;
    Aig_Obj_t * pFanin0, * pFanin1, * pNode;
    char * pToken;
    int i, nPis, nPos, nRegs, Number;
    int * pNum2Id = NULL;  // mapping of node numbers in the file into AIG node IDs
    // open the file
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Saig_ManReadBlif(): Cannot open file for reading.\n" );
        return NULL;
    }
    // skip through the comments
    for ( i = 0; (pToken = Saig_ManReadToken( pFile )) && pToken[0] != '.'; i++ );
    if ( pToken == NULL ) 
        { printf( "Saig_ManReadBlif(): Error 1.\n" ); return NULL; }
    // get he model
    pToken = Saig_ManReadToken( pFile );
    if ( pToken == NULL ) 
        { printf( "Saig_ManReadBlif(): Error 2.\n" ); return NULL; }
    // start the package
    p = Aig_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( pToken );
    p->pSpec = Abc_UtilStrsav( pFileName );
    // count PIs
    pToken = Saig_ManReadToken( pFile );
    if ( pToken == NULL || strcmp( pToken, ".inputs" ) ) 
        { printf( "Saig_ManReadBlif(): Error 3.\n" ); Aig_ManStop(p); return NULL; }
    for ( nPis = 0; (pToken = Saig_ManReadToken( pFile )) && pToken[0] != '.'; nPis++ );
    // count POs
    if ( pToken == NULL || strcmp( pToken, ".outputs" ) ) 
        { printf( "Saig_ManReadBlif(): Error 4.\n" ); Aig_ManStop(p); return NULL; }
    for ( nPos = 0; (pToken = Saig_ManReadToken( pFile )) && pToken[0] != '.'; nPos++ );
    // count latches
    if ( pToken == NULL ) 
        { printf( "Saig_ManReadBlif(): Error 5.\n" ); Aig_ManStop(p); return NULL; }
    for ( nRegs = 0; strcmp( pToken, ".latch" ) == 0; nRegs++ )
    {
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 6.\n" ); Aig_ManStop(p); return NULL; }
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 7.\n" ); Aig_ManStop(p); return NULL; }
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 8.\n" ); Aig_ManStop(p); return NULL; }
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 9.\n" ); Aig_ManStop(p); return NULL; }
    }
    // create PIs and LOs
    for ( i = 0; i < nPis + nRegs; i++ )
        Aig_ObjCreateCi( p );
    Aig_ManSetRegNum( p, nRegs );
    // create nodes
    for ( i = 0; strcmp( pToken, ".names" ) == 0; i++ )
    {
        // first token
        pToken = Saig_ManReadToken( pFile );
        if ( i == 0 && pToken[0] == 'n' )
        { // constant node
            // read 1
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL || strcmp( pToken, "1" ) ) 
                { printf( "Saig_ManReadBlif(): Error 10.\n" ); Aig_ManStop(p); return NULL; }
            // read next
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL ) 
                { printf( "Saig_ManReadBlif(): Error 11.\n" ); Aig_ManStop(p); return NULL; }
            continue;
        }
        pFanin0 = Saig_ManReadNode( p, pNum2Id, pToken );

        // second token
        pToken = Saig_ManReadToken( pFile );
        if ( (pToken[0] == 'p' && pToken[1] == 'o') || (pToken[0] == 'l' && pToken[1] == 'i') )
        { // buffer
            // read complemented attribute
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL ) 
                { printf( "Saig_ManReadBlif(): Error 12.\n" ); Aig_ManStop(p); return NULL; }
            if ( pToken[0] == '0' )
                pFanin0 = Aig_Not(pFanin0);
            // read 1
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL || strcmp( pToken, "1" ) ) 
                { printf( "Saig_ManReadBlif(): Error 13.\n" ); Aig_ManStop(p); return NULL; }
            Aig_ObjCreateCo( p, pFanin0 );
            // read next
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL ) 
                { printf( "Saig_ManReadBlif(): Error 14.\n" ); Aig_ManStop(p); return NULL; }
            continue;
        }

        // third token
        // regular node
        pFanin1 = Saig_ManReadNode( p, pNum2Id, pToken );
        pToken = Saig_ManReadToken( pFile );
        Number = Saig_ManReadNumber( p, pToken );
        // allocate mapping
        if ( pNum2Id == NULL )
        {
//            extern double pow( double x, double y );
            int Size = (int)pow(10.0, (double)(strlen(pToken) - 1));
            pNum2Id = ABC_CALLOC( int, Size );
        }

        // other tokens
        // get the complemented attributes
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 15.\n" ); Aig_ManStop(p); return NULL; }
        if ( pToken[0] == '0' )
            pFanin0 = Aig_Not(pFanin0);
        if ( pToken[1] == '0' )
            pFanin1 = Aig_Not(pFanin1);
        // read 1
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL || strcmp( pToken, "1" ) ) 
            { printf( "Saig_ManReadBlif(): Error 16.\n" ); Aig_ManStop(p); return NULL; }
        // read next
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 17.\n" ); Aig_ManStop(p); return NULL; }

        // create new node
        pNode = Aig_And( p, pFanin0, pFanin1 );
        if ( Aig_IsComplement(pNode) )
            { printf( "Saig_ManReadBlif(): Error 18.\n" ); Aig_ManStop(p); return NULL; }
        // set mapping
        pNum2Id[ Number ] = pNode->Id;
    }
    if ( pToken == NULL || strcmp( pToken, ".end" ) ) 
        { printf( "Saig_ManReadBlif(): Error 19.\n" ); Aig_ManStop(p); return NULL; }
    if ( nPos + nRegs != Aig_ManCoNum(p) ) 
        { printf( "Saig_ManReadBlif(): Error 20.\n" ); Aig_ManStop(p); return NULL; }
    // add non-node objects to the mapping
    Aig_ManForEachCi( p, pNode, i )
        pNum2Id[pNode->Id] = pNode->Id;
//    ABC_FREE( pNum2Id );
    p->pData = pNum2Id;
    // check the new manager
    Aig_ManSetRegNum( p, nRegs );
    if ( !Aig_ManCheck(p) )
        printf( "Saig_ManReadBlif(): Check has failed.\n" );
    return p;
}